

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think-dungeon.c
# Opt level: O3

_Bool borg_think_dungeon_munchkin(void)

{
  uint8_t uVar1;
  short sVar2;
  short sVar3;
  borg_grid *pbVar4;
  loc_conflict grid1;
  loc_conflict grid1_00;
  loc_conflict grid1_01;
  loc_conflict grid1_02;
  chunk_conflict *c;
  int *piVar5;
  _Bool _Var6;
  _Bool _Var7;
  borg_need bVar8;
  wchar_t wVar12;
  square *psVar13;
  loc_conflict lVar14;
  int iVar9;
  wchar_t wVar10;
  loc_conflict lVar15;
  wchar_t wVar11;
  long lVar16;
  loc lVar17;
  borg_track *pbVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  uint8_t uVar22;
  uint uVar23;
  keycode_t k;
  char *pcVar24;
  ulong uVar25;
  wchar_t wVar26;
  borg_grid *pbVar27;
  bool bVar28;
  wchar_t local_48;
  
  pbVar27 = borg_grids[borg.c.y] + borg.c.x;
  lVar17.y = borg.c.y;
  lVar17.x = borg.c.x;
  psVar13 = square(cave,lVar17);
  uVar1 = psVar13->feat;
  borg_notice(true);
  piVar5 = borg.trait;
  if ((borg.trait[0x69] == 0) || (borg.trait[0x6c] != 0)) {
    pcVar24 = "# Leaving munchkin Mode. (Town or Weak)";
    goto LAB_0024804c;
  }
  if (uVar1 == '\x05') {
    if (pbVar27->feat != '\x05') {
      pbVar18 = &track_less;
      uVar19 = (uint)track_less.num;
      uVar22 = '\x05';
      uVar23 = 0;
      if (0 < track_less.num) {
        uVar23 = uVar19;
      }
      if ((-1 < track_less.num) && ((int)uVar23 < (int)track_less.size)) goto LAB_00248106;
      goto LAB_0024812a;
    }
  }
  else if ((uVar1 == '\x06') && (pbVar27->feat != '\x06')) {
    pbVar18 = &track_more;
    uVar19 = (uint)track_more.num;
    if (track_more.num < 1) {
      uVar25 = 0;
    }
    else {
      uVar25 = 0;
      do {
        if ((track_more.x[uVar25] == borg.c.x) && (track_more.y[uVar25] == borg.c.y))
        goto LAB_002480f5;
        uVar25 = uVar25 + 1;
      } while (uVar19 != uVar25);
      uVar25 = (ulong)uVar19;
    }
LAB_002480f5:
    uVar22 = '\x06';
    if (((uint)uVar25 == uVar19) && ((int)(uint)uVar25 < (int)track_more.size)) {
LAB_00248106:
      pbVar18->x[uVar19] = borg.c.x;
      pbVar18->y[uVar19] = borg.c.y;
      pbVar18->num = (short)uVar19 + 1;
      uVar22 = uVar1;
    }
LAB_0024812a:
    pbVar27->feat = uVar22;
  }
  if (track_more.num == 0 && piVar5[0x69] == 1) {
    borg.munchkin_mode = false;
    return false;
  }
  if (track_more.num == 0 && track_less.num == 0) {
    pcVar24 = "# Leaving Munchkin Mode. (No Stairs seen)";
LAB_0024804c:
    borg_note(pcVar24);
    borg.munchkin_mode = false;
    return false;
  }
  bVar8 = borg_maintain_light();
  if (bVar8 == BORG_MET_NEED) {
    return true;
  }
  if (bVar8 == BORG_UNMET_NEED) {
    borg_note("# Munchkin. (need fuel)");
  }
  if (borg.trait[0x1a] == 0) {
    borg_note("# No Light at all.");
  }
  _Var6 = borg_check_rest(borg.c.y,borg.c.x);
  _Var7 = borg_munchkin_mage();
  if (_Var7) {
    return true;
  }
  _Var7 = borg_munchkin_melee();
  if (_Var7) {
    return true;
  }
  if ((_Var6) && (_Var7 = borg_use_things(), _Var7)) {
    return true;
  }
  if ((borg.trait[0x6d] != 0) && (_Var7 = borg_use_things(), _Var7)) {
    return true;
  }
  if (_Var6) {
    _Var7 = borg_wear_stuff();
    if (_Var7) {
      return true;
    }
    _Var7 = borg_remove_stuff();
    if (_Var7) {
      return true;
    }
    _Var7 = borg_drop_junk();
    if (_Var7) {
      return true;
    }
    _Var7 = borg_play_magic(true);
    if (_Var7) {
      return true;
    }
    _Var7 = borg_flow_old(L'\x02');
    if (_Var7) {
      return true;
    }
    _Var7 = borg_flow_take_lunal(true,L'\x05');
    if (_Var7) {
      return true;
    }
    _Var7 = borg_recover();
  }
  else {
    _Var7 = borg_flow_old(L'\x02');
  }
  if (_Var7 != false) {
    return true;
  }
  borg_note("# Fleeing level. Munchkin Mode");
  borg.goal.fleeing_munchkin = true;
  borg.goal.fleeing = true;
  iVar9 = borg.trait[0x69];
  wVar26 = L'\b';
  if (iVar9 < 0xb) {
    wVar26 = (borg.trait[0x23] - iVar9) + L'\b';
  }
  wVar10 = wVar26;
  if (track_less.num == 0) {
    local_48 = L'\xffffffff';
    goto LAB_00248643;
  }
  local_48 = L'\xffffffff';
  if ((borg_items[((ulong)z_info->pack_size - (long)borg.trait[0x9e]) + -2].iqty == '\0') ||
     (((!_Var6 && (pbVar27->feat != '\x05')) && (borg.trait[0x1a] != 0)))) {
LAB_002484b3:
    if (((track_less.num != 0) && (borg_cfg[3] < borg.trait[0x69])) &&
       ((_Var6 || (pbVar27->feat == '\x05')))) {
      lVar20 = (long)borg.c.x;
      pbVar4 = borg_grids[borg.c.y];
      local_48 = L'\xffffffff';
      if (0 < track_less.num) {
        lVar21 = 0;
        do {
          wVar26 = track_less.x[lVar21];
          wVar12 = track_less.y[lVar21];
          lVar15 = loc(wVar26,wVar12);
          lVar14.y = borg.c.y;
          lVar14.x = borg.c.x;
          wVar11 = distance(lVar14,lVar15);
          _Var7 = borg_projectable(wVar12,wVar26,borg.c.y,borg.c.x);
          wVar26 = wVar11;
          if (local_48 < wVar11) {
            wVar26 = local_48;
          }
          if (local_48 == L'\xffffffff') {
            wVar26 = wVar11;
          }
          if (_Var7) {
            local_48 = wVar26;
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < track_less.num);
      }
      if ((!_Var6 || wVar10 <= local_48) && (pbVar4[lVar20].feat != '\x05')) goto LAB_00248643;
      borg_note("# Munchkin Mode.  Power Climb. ");
      borg.goal.less = true;
      _Var7 = borg_flow_old(L'\a');
      if (_Var7) {
        return true;
      }
      _Var7 = borg_flow_stair_less(7,true);
      if (!_Var7) {
        if ((pbVar4[lVar20].feat == '\x05') && ((player->opts).opt[0x20] == false))
        goto LAB_00248b7c;
        goto LAB_00248643;
      }
LAB_002488c8:
      pcVar24 = "# Looking for stairs. Munchkin Mode.";
LAB_002488cf:
      borg_note(pcVar24);
      return true;
    }
LAB_00248643:
    if (((track_more.num == 0) || (borg_cfg[3] <= borg.trait[0x69])) ||
       ((!_Var6 && (pbVar27->feat != '\x06')))) {
LAB_002487b5:
      if (((track_less.num != 0) && (_Var6 && borg.trait[0x69] != 1)) || (pbVar27->feat == '\x05'))
      {
        lVar20 = (long)borg.c.x;
        pbVar4 = borg_grids[borg.c.y];
        if (0 < track_less.num) {
          lVar21 = 0;
          do {
            wVar26 = track_less.x[lVar21];
            wVar12 = track_less.y[lVar21];
            lVar15 = loc(wVar26,wVar12);
            grid1_00.y = borg.c.y;
            grid1_00.x = borg.c.x;
            wVar11 = distance(grid1_00,lVar15);
            _Var7 = borg_projectable(wVar12,wVar26,borg.c.y,borg.c.x);
            wVar26 = wVar11;
            if (local_48 < wVar11) {
              wVar26 = local_48;
            }
            if (local_48 == L'\xffffffff') {
              wVar26 = wVar11;
            }
            if (_Var7) {
              local_48 = wVar26;
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < track_less.num);
        }
        if ((_Var6 && local_48 < wVar10) || (pbVar4[lVar20].feat == '\x05')) {
          borg_note("# Munchkin Mode.  Power Climb. ");
          borg.goal.less = true;
          _Var7 = borg_flow_old(L'\a');
          if (_Var7) {
            return true;
          }
          _Var7 = borg_flow_stair_less(7,true);
          if (_Var7) goto LAB_002488c8;
          if ((pbVar4[lVar20].feat == '\x05') && ((player->opts).opt[0x20] == false))
          goto LAB_00248b7c;
        }
      }
      if (_Var6 && borg.trait[0x69] < 2) {
LAB_0024892d:
        borg_note("Leaving Munchkin Mode. (End of Mode)");
        borg.munchkin_mode = false;
        borg.goal.fleeing = false;
        borg.goal.fleeing_munchkin = false;
        return false;
      }
      _Var6 = borg_flow_old(L'\a');
      if (_Var6) {
        return true;
      }
      borg_note("# Munchkin Mode.  Any Stair. ");
      lVar20 = 0;
      do {
        c = cave;
        lVar21 = (long)borg.c.y;
        sVar2 = ddy_ddd[lVar20];
        lVar16 = (long)borg.c.x;
        sVar3 = ddx_ddd[lVar20];
        lVar17 = (loc)loc((int)(sVar3 + lVar16),(int)(sVar2 + lVar21));
        _Var6 = square_in_bounds(c,lVar17);
        if ((_Var6) &&
           (pbVar27 = borg_grids[sVar2 + lVar21] + sVar3 + lVar16, pbVar27->kill != '\0')) {
          if (0 < track_less.num) {
            lVar21 = 0;
            do {
              wVar26 = track_less.x[lVar21];
              wVar10 = track_less.y[lVar21];
              lVar15 = loc(wVar26,wVar10);
              grid1_01.y = borg.c.y;
              grid1_01.x = borg.c.x;
              wVar12 = distance(grid1_01,lVar15);
              _Var6 = borg_projectable(wVar10,wVar26,borg.c.y,borg.c.x);
              wVar26 = wVar12;
              if (local_48 < wVar12) {
                wVar26 = local_48;
              }
              if (local_48 == L'\xffffffff') {
                wVar26 = wVar12;
              }
              if (!_Var6) {
                wVar26 = local_48;
              }
              local_48 = wVar26;
              lVar21 = lVar21 + 1;
            } while (lVar21 < track_less.num);
          }
          if (0 < track_more.num) {
            lVar21 = 0;
            do {
              wVar26 = track_more.x[lVar21];
              wVar10 = track_more.y[lVar21];
              lVar15 = loc(wVar26,wVar10);
              grid1_02.y = borg.c.y;
              grid1_02.x = borg.c.x;
              wVar12 = distance(grid1_02,lVar15);
              _Var6 = borg_projectable(wVar10,wVar26,borg.c.y,borg.c.x);
              wVar26 = wVar12;
              if (local_48 < wVar12) {
                wVar26 = local_48;
              }
              if (local_48 == L'\xffffffff') {
                wVar26 = wVar12;
              }
              if (_Var6) {
                local_48 = wVar26;
              }
              lVar21 = lVar21 + 1;
            } while (lVar21 < track_more.num);
          }
          if (local_48 < L'\x04') {
            _Var6 = borg_flow_stair_both(7,false);
          }
          else {
            _Var6 = borg_attack(false);
          }
          if (_Var6 != false) {
            return true;
          }
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != 8);
      _Var6 = borg_flow_stair_both(7,false);
      if (_Var6) {
        return true;
      }
      if (pbVar27->feat != '\x06') {
        if ((pbVar27->feat != '\x05') || ((player->opts).opt[0x20] != false)) goto LAB_0024892d;
        goto LAB_00248b7c;
      }
    }
    else {
      local_48 = L'\xffffffff';
      if (0 < track_more.num) {
        borg_note("# Munchkin Mode: I know of a down stair.");
        local_48 = L'\xffffffff';
        if (0 < track_more.num) {
          lVar20 = 0;
          do {
            wVar26 = track_more.x[lVar20];
            wVar12 = track_more.y[lVar20];
            lVar15 = loc(wVar26,wVar12);
            grid1.y = borg.c.y;
            grid1.x = borg.c.x;
            wVar11 = distance(grid1,lVar15);
            _Var7 = borg_projectable(wVar12,wVar26,borg.c.y,borg.c.x);
            wVar26 = wVar11;
            if (local_48 < wVar11) {
              wVar26 = local_48;
            }
            if (local_48 == L'\xffffffff') {
              wVar26 = wVar11;
            }
            if (_Var7) {
              local_48 = wVar26;
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 < track_more.num);
        }
      }
      if (((!_Var6 || wVar10 <= local_48) && (pbVar27->feat != '\x06')) && (borg.trait[0x69] != 1))
      goto LAB_002487b5;
      borg_note("# Munchkin Mode.  Power Diving. ");
      _Var7 = borg_flow_old(L'\a');
      if (_Var7) {
        return true;
      }
      _Var7 = borg_flow_stair_more(7,true,false);
      if (_Var7) {
        return true;
      }
      if (pbVar27->feat != '\x06') goto LAB_002487b5;
    }
    k = 0x3e;
  }
  else {
    lVar20 = (long)borg.c.x;
    pbVar4 = borg_grids[borg.c.y];
    if (track_less.num < 1) {
      bVar28 = true;
    }
    else {
      lVar21 = 0;
      do {
        wVar10 = track_less.x[lVar21];
        wVar12 = track_less.y[lVar21];
        lVar14 = loc(wVar10,wVar12);
        lVar15.y = borg.c.y;
        lVar15.x = borg.c.x;
        wVar11 = distance(lVar15,lVar14);
        _Var7 = borg_projectable(wVar12,wVar10,borg.c.y,borg.c.x);
        wVar10 = wVar11;
        if (local_48 < wVar11) {
          wVar10 = local_48;
        }
        if (local_48 == L'\xffffffff') {
          wVar10 = wVar11;
        }
        if (!_Var7) {
          wVar10 = local_48;
        }
        local_48 = wVar10;
        lVar21 = lVar21 + 1;
      } while (lVar21 < track_less.num);
      iVar9 = borg.trait[0x69];
      bVar28 = track_less.num != 0;
    }
    wVar10 = L'\x14';
    if (iVar9 != 1) {
      wVar10 = wVar26;
    }
    if (!bVar28) {
      wVar10 = wVar26;
    }
    if ((!_Var6 || wVar10 <= local_48) && (pbVar4[lVar20].feat != '\x05')) goto LAB_002484b3;
    borg_note("# Munchkin Mode.  Power Climb (needing to sell). ");
    borg.goal.less = true;
    _Var7 = borg_flow_old(L'\a');
    if (_Var7) {
      return true;
    }
    _Var7 = borg_flow_stair_less(7,true);
    if (_Var7) {
      pcVar24 = "# Looking for stairs. Munchkin Mode (needing to sell).";
      goto LAB_002488cf;
    }
    if ((pbVar4[lVar20].feat != '\x05') || ((player->opts).opt[0x20] != false)) goto LAB_002484b3;
LAB_00248b7c:
    k = 0x3c;
  }
  borg_keypress(k);
  return true;
}

Assistant:

static bool borg_think_dungeon_munchkin(void)
{
    bool safe_place = false;
    int  bb_j       = z_info->max_range;
    int  j, b_j = -1;
    int  i, ii, x, y;
    int  closeness = 8;

    borg_grid *ag  = &borg_grids[borg.c.y][borg.c.x];

    uint8_t feat   = square(cave, borg.c)->feat;

    enum borg_need need;

    /* examine equipment and swaps */
    borg_notice(true);

    /* Not if starving or in town */
    if (borg.trait[BI_CDEPTH] == 0 || borg.trait[BI_ISWEAK]) {
        borg_note("# Leaving munchkin Mode. (Town or Weak)");
        borg.munchkin_mode = false;
        return false;
    }

    /* if borg is just starting on this level, he may not
     * know that a stair is under him.  Cheat to see if one is
     * there
     */
    if (feat == FEAT_MORE && ag->feat != FEAT_MORE) {

        /* Check for an existing "down stairs" */
        for (i = 0; i < track_more.num; i++) {
            /* We already knew about that one */
            if ((track_more.x[i] == borg.c.x) && (track_more.y[i] == borg.c.y))
                break;
        }

        /* Track the newly discovered "down stairs" */
        if ((i == track_more.num) && (i < track_more.size)) {
            track_more.x[i] = borg.c.x;
            track_more.y[i] = borg.c.y;
            track_more.num++;
        }
        /* tell the array */
        ag->feat = FEAT_MORE;
    }

    if (feat == FEAT_LESS && ag->feat != FEAT_LESS) {

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            /* We already knew about this one */
            if ((track_less.x[i] == borg.c.x) && (track_less.y[i] == borg.c.y))
                continue;
        }

        /* Track the newly discovered "up stairs" */
        if ((i == track_less.num) && (i < track_less.size)) {
            track_less.x[i] = borg.c.x;
            track_less.y[i] = borg.c.y;
            track_less.num++;
        }

        /* Tell the array */
        ag->feat = FEAT_LESS;
    }

    /* Act normal on 1 unless stairs are seen*/
    if (borg.trait[BI_CDEPTH] == 1 && track_more.num == 0) {
        borg.munchkin_mode = false;
        return false;
    }

    /* If no down stair is known, act normal */
    if (track_more.num == 0 && track_less.num == 0) {
        borg_note("# Leaving Munchkin Mode. (No Stairs seen)");
        borg.munchkin_mode = false;
        return false;
    }

    /** First deal with staying alive **/

    /* Hack -- require light */
    need = borg_maintain_light();
    if (need == BORG_MET_NEED)
        return true;
    else if (need == BORG_UNMET_NEED)
        borg_note("# Munchkin. (need fuel)");

    /* No Light at all */
    if (borg.trait[BI_LIGHT] == 0) {
        borg_note("# No Light at all.");
    }

    /* Define if safe_place is true or not */
    safe_place = borg_check_rest(borg.c.y, borg.c.x);

    /* Can do a little attacking. */
    if (borg_munchkin_mage())
        return true;
    if (borg_munchkin_melee())
        return true;

    /* Consume needed things */
    if (safe_place && borg_use_things())
        return true;

    /* Consume needed things */
    if (borg.trait[BI_ISHUNGRY] && borg_use_things())
        return true;

    /* Wear stuff and see if it's good */
    if (safe_place && borg_wear_stuff())
        return true;

    if (safe_place && borg_remove_stuff())
        return true;

    /* Crush junk if convenient */
    if (safe_place && borg_drop_junk())
        return true;

    /* Learn learn and test useful spells */
    if (safe_place && borg_play_magic(true))
        return true;

    /** Track down some interesting gear **/
    /* XXX Should we allow him great flexibility in retrieving loot? (not always
     * safe?)*/
    /* Continue flowing towards objects */
    if (borg_flow_old(GOAL_TAKE))
        return true;

    /* Borg may be off the stair and a monster showed up. */

    /* Find a (viewable) object */
    if (safe_place && borg_flow_take_lunal(true, 5))
        return true;

    /* Recover from any nasty condition */
    if (safe_place && borg_recover())
        return true;

    /*leave level right away. */
    borg_note("# Fleeing level. Munchkin Mode");
    borg.goal.fleeing_munchkin = true;
    borg.goal.fleeing          = true;

    /* Increase the range of the borg a bit */
    if (borg.trait[BI_CDEPTH] <= 10)
        closeness
            += (borg.trait[BI_CLEVEL] - 10) + (10 - borg.trait[BI_CDEPTH]);

    /* Full of Items - Going up */
    if (track_less.num && (borg_items[PACK_SLOTS - 2].iqty)
        && (safe_place || ag->feat == FEAT_LESS
            || borg.trait[BI_LIGHT] == 0)) {
        borg_grid *tmp_ag = &borg_grids[borg.c.y][borg.c.x];

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            x = track_less.x[i];
            y = track_less.y[i];

            /* How far is the nearest up stairs */
            j = distance(borg.c, loc(x, y));

            /* Is it reachable or behind a wall? */
            if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                continue;

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
        }

        /* if on depth 1, try to venture more to get back to town */
        if (borg.trait[BI_CDEPTH] == 1) {
            if (track_less.num) {
                closeness = 20;
            }
        }

        /* if the upstair is close and safe path, continue */
        if ((b_j < closeness && safe_place) || tmp_ag->feat == FEAT_LESS) {

            /* Note */
            borg_note("# Munchkin Mode.  Power Climb (needing to sell). ");

            /* Set to help borg move better */
            borg.goal.less = true;

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to UpStair */
            if (borg_flow_stair_less(GOAL_FLEE, true)) {
                borg_note(
                    "# Looking for stairs. Munchkin Mode (needing to sell).");

                /* Success */
                return true;
            }

            if (tmp_ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
                /* Take the Up Stair */
                borg_keypress('<');
                return true;
            }
        }
    }

    /* Too deep. trying to gradually move shallow.  Going up */
    if ((track_less.num
            && borg.trait[BI_CDEPTH] > borg_cfg[BORG_MUNCHKIN_DEPTH])
        && (safe_place || ag->feat == FEAT_LESS)) {

        borg_grid *tmp_ag = &borg_grids[borg.c.y][borg.c.x];

        /* Reset */
        b_j = -1;

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            x = track_less.x[i];
            y = track_less.y[i];

            /* How far is the nearest up stairs */
            j = distance(borg.c, loc(x, y));

            /* Is it reachable or behind a wall? */
            if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                continue;

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
            if (b_j < bb_j)
                bb_j = b_j;
        }

        /* if the upstair is close and safe path, continue */
        if ((b_j < closeness && safe_place) || tmp_ag->feat == FEAT_LESS) {

            /* Note */
            borg_note("# Munchkin Mode.  Power Climb. ");

            /* Set to help borg move better */
            borg.goal.less = true;

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to UpStair */
            if (borg_flow_stair_less(GOAL_FLEE, true)) {
                borg_note("# Looking for stairs. Munchkin Mode.");

                /* Success */
                return true;
            }

            if (tmp_ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
                /* Take the Up Stair */
                borg_keypress('<');
                return true;
            }
        }
    }

    /* Going down */
    if ((track_more.num
            && borg.trait[BI_CDEPTH] < borg_cfg[BORG_MUNCHKIN_DEPTH])
        && (safe_place || ag->feat == FEAT_MORE)) {
        /* Reset */
        b_j = -1;

        if (track_more.num >= 1)
            borg_note("# Munchkin Mode: I know of a down stair.");

        /* Check for an existing "down stairs" */
        for (i = 0; i < track_more.num; i++) {
            x = track_more.x[i];
            y = track_more.y[i];

            /* How far is the nearest down stairs */
            j = distance(borg.c, loc(x, y));

            /* Is it reachable or behind a wall? */
            if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                continue;

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
        }

        /* if the downstair is close and path is safe, continue on */
        if ((b_j < closeness && safe_place) || ag->feat == FEAT_MORE
            || borg.trait[BI_CDEPTH] == 1) {
            /* Note */
            borg_note("# Munchkin Mode.  Power Diving. ");

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to DownStair */
            if (borg_flow_stair_more(GOAL_FLEE, true, false))
                return true;

            /* if standing on a stair */
            if (ag->feat == FEAT_MORE) {
                /* Take the DownStair */
                borg_keypress('>');

                return true;
            }
        }
    }

    /* Going up */
    if ((track_less.num && borg.trait[BI_CDEPTH] != 1 && safe_place)
        || ag->feat == FEAT_LESS) {
        borg_grid *tmp_ag = &borg_grids[borg.c.y][borg.c.x];

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            x = track_less.x[i];
            y = track_less.y[i];

            /* How far is the nearest up stairs */
            j = distance(borg.c, loc(x, y));

            /* Is it reachable or behind a wall? */
            if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                continue;

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
        }

        /* if the upstair is close and safe path, continue */
        if ((b_j < closeness && safe_place) || tmp_ag->feat == FEAT_LESS) {

            /* Note */
            borg_note("# Munchkin Mode.  Power Climb. ");

            /* Set to help borg move better */
            borg.goal.less = true;

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to UpStair */
            if (borg_flow_stair_less(GOAL_FLEE, true)) {
                borg_note("# Looking for stairs. Munchkin Mode.");

                /* Success */
                return true;
            }

            if (tmp_ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
                /* Take the Up Stair */
                borg_keypress('<');
                return true;
            }
        }
    }

    /* Special case where the borg is off a stair and there
     * is a monster in LOS.  He could freeze and unhook, or
     * move to the closest stair and risk the run.
     */
    if (borg.trait[BI_CDEPTH] >= 2 || !safe_place) {
        /* Continue fleeing to stair */
        if (borg_flow_old(GOAL_FLEE))
            return true;

        /* Note */
        borg_note("# Munchkin Mode.  Any Stair. ");

        /* Adjacent Monster.  Either attack it, or try to outrun it */
        for (i = 0; i < 8; i++) {
            y = borg.c.y + ddy_ddd[i];
            x = borg.c.x + ddx_ddd[i];

            /* Bounds check */
            if (!square_in_bounds(cave, loc(x, y)))
                continue;

            /* Get the grid */
            ag = &borg_grids[y][x];

            /* Monster is adjacent to the borg */
            if (ag->kill) {
                /* Check for an existing "up stairs" */
                for (ii = 0; ii < track_less.num; ii++) {
                    x = track_less.x[ii];
                    y = track_less.y[ii];

                    /* How far is the nearest up stairs */
                    j = distance(borg.c, loc(x, y));

                    /* Is it reachable or behind a wall? */
                    if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                        continue;

                    /* skip the far ones */
                    if (b_j <= j && b_j != -1)
                        continue;

                    /* track it */
                    b_j = j;
                }

                /* Check for an existing "down stairs" */
                for (ii = 0; ii < track_more.num; ii++) {
                    x = track_more.x[ii];
                    y = track_more.y[ii];

                    /* How far is the nearest down stairs */
                    j = distance(borg.c, loc(x, y));

                    /* Is it reachable or behind a wall? */
                    if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                        continue;

                    /* skip the far ones */
                    if (b_j <= j && b_j != -1)
                        continue;

                    /* track it */
                    b_j = j;
                }

                /* Can the borg risk the run? */
                if (b_j <= 3) {
                    /* Try to find some stairs */
                    if (borg_flow_stair_both(GOAL_FLEE, false))
                        return true;
                } else {
                    /* Try to kill it */
                    if (borg_attack(false))
                        return true;
                }
            } /* Adjacent to kill */
        } /* Scanning neighboring grids */

        /* Try to find some stairs */
        if (borg_flow_stair_both(GOAL_FLEE, false))
            return true;
        if (ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
            /* Take the Up Stair */
            borg_keypress('<');
            return true;
        }
        if (ag->feat == FEAT_MORE) {
            /* Take the Stair */
            borg_keypress('>');
            return true;
        }
    }

    /* return to normal borg_think_dungeon */
    borg_note("Leaving Munchkin Mode. (End of Mode)");
    borg.munchkin_mode = false;
    borg.goal.fleeing = borg.goal.fleeing_munchkin = false;
    return false;
}